

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int handle_name_attribute_for_type(parser_info *info,char **attr)

{
  int iVar1;
  char *pcVar2;
  char *name;
  char **attr_local;
  parser_info *info_local;
  
  if (info->node->parent->parent == (node_info_struct *)0x0) {
    pcVar2 = get_mandatory_attribute_value(attr,"name",info->node->tag);
    if (pcVar2 == (char *)0x0) {
      return -1;
    }
    iVar1 = strcmp(pcVar2,info->entry_base_name);
    if (iVar1 != 0) {
      coda_set_error(-400,"definition for named type \'%s\' has incorrect \'name\' attribute",
                     info->entry_base_name);
      return -1;
    }
    iVar1 = coda_type_set_name((coda_type *)info->node->data,pcVar2);
    if (iVar1 != 0) {
      return -1;
    }
  }
  else {
    pcVar2 = get_attribute_value(attr,"name");
    if (pcVar2 != (char *)0x0) {
      coda_set_error(-400,"type may not have a \'name\' attribute unless it is a top level element")
      ;
      return -1;
    }
  }
  return 0;
}

Assistant:

static int handle_name_attribute_for_type(parser_info *info, const char **attr)
{
    const char *name;

    if (info->node->parent->parent == NULL)
    {
        /* this is a top-level type, we require a name */
        name = get_mandatory_attribute_value(attr, "name", info->node->tag);
        if (name == NULL)
        {
            return -1;
        }
        /* verify that the name matches the filename */
        if (strcmp(name, info->entry_base_name) != 0)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION,
                           "definition for named type '%s' has incorrect 'name' attribute", info->entry_base_name);
            return -1;
        }
        if (coda_type_set_name((coda_type *)info->node->data, name) != 0)
        {
            return -1;
        }
    }
    else
    {
        name = get_attribute_value(attr, "name");
        if (name != NULL)
        {
            /* we have a named type that is not a top-level type - this is not allowed */
            coda_set_error(CODA_ERROR_DATA_DEFINITION,
                           "type may not have a 'name' attribute unless it is a top level element");
            return -1;
        }
    }

    return 0;
}